

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignaturePruning.cpp
# Opt level: O2

bool __thiscall
wasm::anon_unknown_147::SignaturePruning::iteration(SignaturePruning *this,Module *module)

{
  __node_base_ptr this_00;
  __node_base_ptr *pp_Var1;
  pointer puVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  long *plVar5;
  _Hash_node_base *p_Var6;
  __node_base _Var7;
  Type TVar8;
  Type TVar9;
  pointer puVar10;
  bool bVar11;
  uint uVar12;
  mapped_type_conflict *pmVar13;
  Function *pFVar14;
  mapped_type *pmVar15;
  Call *pCVar16;
  Expression **ppEVar17;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *this_01;
  size_t sVar18;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar19;
  size_type sVar20;
  Type *__x;
  mapped_type *pmVar21;
  _Hash_node_base *p_Var22;
  size_type *psVar23;
  pointer puVar24;
  pointer ppCVar25;
  pointer ppCVar26;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  long *plVar27;
  _Hash_node_base *p_Var28;
  undefined1 auVar29 [8];
  __node_base *p_Var30;
  optional<wasm::HeapType> oVar31;
  undefined1 local_478 [8];
  InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  sigFuncs;
  undefined1 local_318 [8];
  SubTypes subTypes;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  undefined1 local_210 [8];
  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
  allInfo;
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
  callTargetsToLocalize;
  unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
  newSignatures;
  Type oldParams;
  undefined1 auStack_f8 [8];
  SortedVector unusedParams;
  Signature sig;
  undefined1 auStack_c8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  undefined1 local_a8 [8];
  SortedVector optimizedIndexes;
  _Storage<wasm::HeapType,_true> _Stack_88;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  callTargetTypes;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *f;
  _Storage<wasm::HeapType,_true> local_38;
  Module *module_local;
  
  allInfo._M_h._M_single_bucket = (__node_base_ptr)&local_38;
  analysis._24_8_ = &analysis.field_0x8;
  analysis._8_4_ = 0;
  analysis._16_8_ = 0;
  analysis._40_8_ = 0;
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  analysis._32_8_ = analysis._24_8_;
  local_38 = (_Storage<wasm::HeapType,_true>)module;
  for (puVar24 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar2; puVar24 = puVar24 + 1
      ) {
    local_478 = (undefined1  [8])
                (puVar24->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    std::
    map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
    ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                  *)&analysis,(key_type *)local_478);
  }
  std::function<void_(wasm::Function_*,_Info_&)>::function
            ((function<void_(wasm::Function_*,_Info_&)> *)&analysis.field_0x30,
             (function<void_(wasm::Function_*,_Info_&)>_conflict *)&allInfo._M_h._M_single_bucket);
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar24 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar2; puVar24 = puVar24 + 1
      ) {
    pFVar14 = (puVar24->_M_t).
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(pFVar14->super_Importable).module + 8) != (char *)0x0) {
      local_478 = (undefined1  [8])pFVar14;
      pmVar13 = std::
                map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                              *)&analysis,(key_type *)local_478);
      std::function<void_(wasm::Function_*,_Info_&)>::operator()
                ((function<void_(wasm::Function_*,_Info_&)> *)&analysis.field_0x30,pFVar14,pmVar13);
    }
  }
  PassRunner::PassRunner((PassRunner *)local_318,module);
  std::function<void_(wasm::Function_*,_Info_&)>::function
            ((function<void_(wasm::Function_*,_Info_&)> *)local_210,
             (function<void_(wasm::Function_*,_Info_&)>_conflict *)&analysis.field_0x30);
  wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::
  iteration(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std
  ::function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::
  Module*)::Info&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::Function*,wasm::
  (anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info,std::less<wasm::
  Function*>,std::allocator<std::pair<wasm::Function*const,wasm::(anonymous_namespace)::
  SignaturePruning::iteration(wasm::Module*)::Info>>>&,std::function<void(wasm::Function*,wasm::
  (anonymous_namespace)::SignaturePruning::iteration(wasm::Module*)::Info__>_
            (local_478,module,(Map *)&analysis,(Func *)local_210);
  Pass::setPassRunner((Pass *)local_478,(PassRunner *)local_318);
  (**(code **)&(((Importable *)local_478)->super_Named).hasExplicitName)((Pass *)local_478,module);
  ::anon_func::Mapper::~Mapper((Mapper *)local_478);
  std::_Function_base::~_Function_base((_Function_base *)local_210);
  PassRunner::~PassRunner((PassRunner *)local_318);
  std::_Function_base::~_Function_base((_Function_base *)&analysis.field_0x30);
  std::_Function_base::~_Function_base((_Function_base *)&allInfo._M_h._M_single_bucket);
  local_210 = (undefined1  [8])&allInfo._M_h._M_rehash_policy._M_next_resize;
  allInfo._M_h._M_buckets = (__buckets_ptr)0x1;
  allInfo._M_h._M_bucket_count = 0;
  allInfo._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  allInfo._M_h._M_element_count._0_4_ = 0x3f800000;
  allInfo._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  allInfo._M_h._M_rehash_policy._4_4_ = 0;
  allInfo._M_h._M_rehash_policy._M_next_resize = 0;
  local_478 = (undefined1  [8])&sigFuncs.Map._M_h._M_rehash_policy._M_next_resize;
  sigFuncs.Map._M_h._M_buckets = (__buckets_ptr)0x1;
  sigFuncs.Map._M_h._M_bucket_count = 0;
  sigFuncs.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  sigFuncs.Map._M_h._M_element_count._0_4_ = 0x3f800000;
  sigFuncs.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  sigFuncs.Map._M_h._M_rehash_policy._4_4_ = 0;
  sigFuncs.Map._M_h._M_rehash_policy._M_next_resize = 0;
  sigFuncs.Map._M_h._M_single_bucket = (__node_base_ptr)&sigFuncs.Map._M_h._M_single_bucket;
  sigFuncs.List.
  super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  analysis._48_8_ = &callTargetsToLocalize._M_h._M_rehash_policy._M_next_resize;
  callTargetsToLocalize._M_h._M_buckets = (__buckets_ptr)0x1;
  callTargetsToLocalize._M_h._M_bucket_count = 0;
  callTargetsToLocalize._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  callTargetsToLocalize._M_h._M_element_count._0_4_ = 0x3f800000;
  callTargetsToLocalize._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  callTargetsToLocalize._M_h._M_rehash_policy._4_4_ = 0;
  callTargetsToLocalize._M_h._M_rehash_policy._M_next_resize = 0;
  optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)((long)local_38 + 0x20);
  pp_Var1 = &callTargetsToLocalize._M_h._M_single_bucket;
  sigFuncs.List.
  super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)sigFuncs.Map._M_h._M_single_bucket;
  for (puVar24 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    *)((long)local_38 + 0x18))->
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      puVar24 !=
      (pointer)optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; puVar24 = puVar24 + 1) {
    local_318 = *(undefined1 (*) [8])
                 &(puVar24->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
    pmVar13 = std::
              map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
              ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                            *)&analysis,(key_type *)local_318);
    ppCVar3 = (pmVar13->calls).super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar25 = (pmVar13->calls).super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppCVar25 != ppCVar3;
        ppCVar25 = ppCVar25 + 1) {
      callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)*ppCVar25;
      pFVar14 = Module::getFunction((Module *)local_38,
                                    (Name)(((Call *)callTargetsToLocalize._M_h._M_single_bucket)->
                                          target).super_IString.str);
      pmVar15 = std::
                unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                              *)local_210,&pFVar14->type);
      std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::push_back
                (&pmVar15->calls,(value_type *)pp_Var1);
      _Stack_88 = local_38;
      pCVar16 = Intrinsics::isCallWithoutEffects
                          ((Intrinsics *)&_Stack_88._M_value,
                           (Expression *)callTargetsToLocalize._M_h._M_single_bucket);
      if (pCVar16 != (Call *)0x0) {
        ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)(callTargetsToLocalize._M_h._M_single_bucket + 2));
        if (((*ppEVar17)->type).id != 1) {
          _Stack_88._M_value = wasm::Type::getHeapType(&(*ppEVar17)->type);
          pmVar15 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)local_210,&_Stack_88._M_value);
          pmVar15->optimizable = false;
        }
      }
    }
    ppCVar4 = (pmVar13->callRefs).
              super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar26 = (pmVar13->callRefs).
                    super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppCVar26 != ppCVar4; ppCVar26 = ppCVar26 + 1)
    {
      callTargetsToLocalize._M_h._M_single_bucket = (__node_base_ptr)*ppCVar26;
      _Stack_88 = (_Storage<wasm::HeapType,_true>)
                  (((CallRef *)callTargetsToLocalize._M_h._M_single_bucket)->target->type).id;
      if (_Stack_88 != (_Storage<wasm::HeapType,_true>)0x1) {
        local_a8 = (undefined1  [8])wasm::Type::getHeapType((Type *)&_Stack_88._M_value);
        pmVar15 = std::
                  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                  ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                *)local_210,(key_type *)local_a8);
        std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::push_back
                  (&pmVar15->callRefs,(value_type *)pp_Var1);
      }
    }
    pmVar15 = std::
              unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
              ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                            *)local_210,(HeapType *)((long)local_318 + 0x38));
    p_Var30 = &(pmVar13->usedParams)._M_h._M_before_begin;
    while (p_Var30 = p_Var30->_M_nxt, p_Var30 != (__node_base *)0x0) {
      callTargetsToLocalize._M_h._M_single_bucket =
           (__node_base_ptr)
           CONCAT44(callTargetsToLocalize._M_h._M_single_bucket._4_4_,
                    (int)*(size_type *)(p_Var30 + 1));
      std::__detail::
      _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&pmVar15->usedParams,(value_type *)pp_Var1);
    }
    if (pmVar13->optimizable == false) {
      pmVar15 = std::
                unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                              *)local_210,(HeapType *)((long)local_318 + 0x38));
      pmVar15->optimizable = false;
    }
    this_01 = InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
              ::operator[]((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                            *)local_478,(HeapType *)((long)local_318 + 0x38));
    std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
              (this_01,(value_type *)local_318);
  }
  wasm::ModuleUtils::getPublicHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_318,(Module *)local_38
            );
  pp_Var1 = &callTargetsToLocalize._M_h._M_single_bucket;
  for (auVar29 = local_318;
      auVar29 !=
      (undefined1  [8])
      subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start;
      auVar29 = (undefined1  [8])
                &(((Function *)auVar29)->super_Importable).super_Named.name.super_IString.str._M_str
      ) {
    callTargetsToLocalize._M_h._M_single_bucket =
         (__node_base_ptr)
         (((Function *)auVar29)->super_Importable).super_Named.name.super_IString.str._M_len;
    bVar11 = HeapType::isFunction((HeapType *)pp_Var1);
    if (bVar11) {
      pmVar15 = std::
                unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                              *)local_210,(key_type *)pp_Var1);
      pmVar15->optimizable = false;
    }
  }
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_318);
  plVar5 = *(long **)((long)local_38 + 0x50);
  for (plVar27 = *(long **)((long)local_38 + 0x48); plVar27 != plVar5; plVar27 = plVar27 + 1) {
    pmVar15 = std::
              unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
              ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                            *)local_210,(key_type *)(*plVar27 + 0x38));
    pmVar15->optimizable = false;
  }
  SubTypes::SubTypes((SubTypes *)local_318,(Module *)local_38);
  callTargetsToLocalize._M_h._M_single_bucket =
       (__node_base_ptr)&newSignatures._M_h._M_rehash_policy._M_next_resize;
  newSignatures._M_h._M_buckets = (__buckets_ptr)0x1;
  newSignatures._M_h._M_bucket_count = 0;
  newSignatures._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  newSignatures._M_h._M_element_count._0_4_ = 0x3f800000;
  newSignatures._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  newSignatures._M_h._M_rehash_policy._4_4_ = 0;
  newSignatures._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var28 = sigFuncs.Map._M_h._M_single_bucket;
  do {
    if (p_Var28 == (_Hash_node_base *)&sigFuncs.Map._M_h._M_single_bucket) {
      _Stack_88 = (_Storage<wasm::HeapType,_true>)0x0;
      callTargetTypes._M_h._M_buckets = (__buckets_ptr)0x0;
      callTargetTypes._M_h._M_bucket_count = 0;
      GlobalTypeRewriter::updateSignatures
                ((SignatureUpdates *)&callTargetsToLocalize._M_h._M_single_bucket,(Module *)local_38
                 ,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&_Stack_88._M_value);
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &_Stack_88._M_value);
      _Var7 = callTargetsToLocalize._M_h._M_before_begin;
      if (callTargetsToLocalize._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        _Stack_88 = (_Storage<wasm::HeapType,_true>)
                    &callTargetTypes._M_h._M_rehash_policy._M_next_resize;
        callTargetTypes._M_h._M_buckets = (__buckets_ptr)0x1;
        callTargetTypes._M_h._M_bucket_count = 0;
        callTargetTypes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        callTargetTypes._M_h._M_element_count._0_4_ = 0x3f800000;
        callTargetTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        callTargetTypes._M_h._M_rehash_policy._4_4_ = 0;
        callTargetTypes._M_h._M_rehash_policy._M_next_resize = 0;
        psVar23 = &callTargetsToLocalize._M_h._M_bucket_count;
        while (psVar23 = (size_type *)*psVar23, psVar23 != (size_type *)0x0) {
          p_Var28 = ((__node_base *)(psVar23 + 1))->_M_nxt;
          local_a8 = (undefined1  [8])0x10;
          if (*(char *)&p_Var28->_M_nxt == '=') {
            local_a8 = (undefined1  [8])wasm::Type::getHeapType((Type *)(p_Var28[6]._M_nxt + 1));
          }
          else {
            if (*(char *)&p_Var28->_M_nxt != '\x06') {
              handle_unreachable("bad call",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SignaturePruning.cpp"
                                 ,0x13e);
            }
            pFVar14 = Module::getFunction((Module *)local_38,(IString)*(IString *)&p_Var28[6]._M_nxt
                                         );
            local_a8 = (undefined1  [8])(pFVar14->type).id;
          }
          std::__detail::
          _Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&_Stack_88._M_value,(value_type *)local_a8);
        }
        ParamUtils::localizeCallsTo
                  ((unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                    *)&_Stack_88._M_value,(Module *)local_38,(this->super_Pass).runner);
        std::
        _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&_Stack_88._M_value);
      }
      std::
      _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&callTargetsToLocalize._M_h._M_single_bucket);
      SubTypes::~SubTypes((SubTypes *)local_318);
      std::
      _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&analysis.field_0x30);
      InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
      ::~InsertOrderedMap((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                           *)local_478);
      std::
      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
      ::~unordered_map((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                        *)local_210);
      std::
      map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
      ::~map((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
              *)&analysis);
      return _Var7._M_nxt != (_Hash_node_base *)0x0;
    }
    this_00 = p_Var28 + 2;
    join_0x00000010_0x00000000_ = HeapType::getSignature((HeapType *)this_00);
    pmVar15 = std::
              unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
              ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                            *)local_210,(key_type *)this_00);
    sVar18 = wasm::Type::size((Type *)&unusedParams.
                                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pmVar15->optimizable != false) {
      pvVar19 = SubTypes::getImmediateSubTypes((SubTypes *)local_318,(HeapType)this_00->_M_nxt);
      if ((pvVar19->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
          super__Vector_impl_data._M_start ==
          (pvVar19->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        oVar31 = HeapType::getDeclaredSuperType((HeapType *)this_00);
        _Stack_88 = oVar31.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_payload;
        callTargetTypes._M_h._M_buckets =
             (__buckets_ptr)
             CONCAT71(callTargetTypes._M_h._M_buckets._1_7_,
                      oVar31.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_engaged);
        if (((undefined1  [16])
             oVar31.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          bVar11 = HeapType::isSignature(&_Stack_88._M_value);
          if (bVar11) goto LAB_00b25df9;
        }
        optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&pmVar15->callRefs;
        ParamUtils::applyConstantValues
                  ((SortedVector *)local_a8,
                   (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)(p_Var28 + 3),
                   &pmVar15->calls,
                   (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                   optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(Module *)local_38);
        puVar10 = optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (auVar29 = local_a8; auVar29 != (undefined1  [8])puVar10;
            auVar29 = (undefined1  [8])((long)auVar29 + 4)) {
          _Stack_88._M_value.id._0_4_ = *(uint *)auVar29;
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&(pmVar15->usedParams)._M_h,&_Stack_88);
        }
        if ((pmVar15->usedParams)._M_h._M_element_count != sVar18) {
          auStack_f8 = (undefined1  [8])0x0;
          unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          uVar12 = 0;
          while (_Stack_88._M_value.id._0_4_ = uVar12, uVar12 < sVar18) {
            sVar20 = std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&(pmVar15->usedParams)._M_h,(key_type *)&_Stack_88);
            if (sVar20 == 0) {
              SortedVector::insert((SortedVector *)auStack_f8,_Stack_88._M_value.id._0_4_);
            }
            uVar12 = _Stack_88._M_value.id._0_4_ + 1;
          }
          newSignatures._M_h._M_single_bucket =
               (__node_base_ptr)
               unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_228,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_f8);
          ParamUtils::removeParameters
                    ((pair<wasm::SortedVector,_wasm::ParamUtils::RemovalOutcome> *)
                     &_Stack_88._M_value,
                     (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)(p_Var28 + 3),
                     (SortedVector *)&local_228,&pmVar15->calls,
                     (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                     optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Module *)local_38,
                     (this->super_Pass).runner);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_228);
          if ((int)callTargetTypes._M_h._M_before_begin._M_nxt == 1) {
            ppCVar25 = (pmVar15->calls).
                       super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (ppCVar25 ==
                (pmVar15->calls).super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              ppCVar26 = (pmVar15->callRefs).
                         super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              if (ppCVar26 ==
                  (pmVar15->callRefs).
                  super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                __assert_fail("!info.callRefs.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SignaturePruning.cpp"
                              ,0x100,
                              "bool wasm::(anonymous namespace)::SignaturePruning::iteration(Module *)"
                             );
              }
              auStack_c8 = (undefined1  [8])*ppCVar26;
              std::__detail::
              _Insert<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              ::insert((_Insert<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                        *)&analysis.field_0x30,(value_type *)auStack_c8);
            }
            else {
              auStack_c8 = (undefined1  [8])*ppCVar25;
              std::__detail::
              _Insert<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              ::insert((_Insert<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                        *)&analysis.field_0x30,(value_type *)auStack_c8);
            }
          }
          if (_Stack_88 != (_Storage<wasm::HeapType,_true>)callTargetTypes._M_h._M_buckets) {
            auStack_c8 = (undefined1  [8])0x0;
            newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (uVar12 = 0; uVar12 < sVar18; uVar12 = uVar12 + 1) {
              bVar11 = SortedVector::has((SortedVector *)&_Stack_88._M_value,uVar12);
              if (!bVar11) {
                __x = wasm::Type::operator[]
                                ((Type *)&newSignatures._M_h._M_single_bucket,(ulong)uVar12);
                std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                          ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_c8,__x);
              }
            }
            wasm::Type::Type(&oldParams,
                             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_c8);
            TVar8 = oldParams;
            TVar9.id = sig.params.id;
            pmVar21 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&callTargetsToLocalize._M_h._M_single_bucket,
                                   (key_type *)this_00);
            (pmVar21->params).id = TVar8.id;
            (pmVar21->results).id = TVar9.id;
            p_Var6 = p_Var28[4]._M_nxt;
            for (p_Var22 = p_Var28[3]._M_nxt; p_Var22 != p_Var6; p_Var22 = p_Var22 + 1) {
              p_Var22->_M_nxt[7]._M_nxt = this_00->_M_nxt;
            }
            std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                      ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_c8);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &_Stack_88._M_value);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_f8);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
      }
    }
LAB_00b25df9:
    p_Var28 = p_Var28->_M_nxt;
  } while( true );
}

Assistant:

bool iteration(Module* module) {
    // First, find all the information we need. Start by collecting inside each
    // function in parallel.

    struct Info {
      std::vector<Call*> calls;
      std::vector<CallRef*> callRefs;

      std::unordered_set<Index> usedParams;

      // If we set this to false, we may not attempt to perform any optimization
      // whatsoever on this data.
      bool optimizable = true;
    };

    ModuleUtils::ParallelFunctionAnalysis<Info> analysis(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Imports cannot be modified.
          info.optimizable = false;
          return;
        }

        info.calls = std::move(FindAll<Call>(func->body).list);
        info.callRefs = std::move(FindAll<CallRef>(func->body).list);
        info.usedParams = ParamUtils::getUsedParams(func, module);
      });

    // A map of types to all the information combined over all the functions
    // with that type.
    std::unordered_map<HeapType, Info> allInfo;

    // Map heap types to all functions with that type.
    InsertOrderedMap<HeapType, std::vector<Function*>> sigFuncs;

    // Heap types of call targets that we found we should localize calls to, in
    // order to fully handle them. (See similar code in DeadArgumentElimination
    // for individual functions; here we handle a HeapType at a time.) A slight
    // complication is that we cannot track heap types here: heap types are
    // rewritten using |GlobalTypeRewriter::updateSignatures| below, and even
    // types that we do not modify end up replaced (as the entire set of types
    // becomes one new big rec group). We therefore need something more stable
    // to track here, which we do using either a Call or a Call Ref.
    std::unordered_set<Expression*> callTargetsToLocalize;

    // Combine all the information we gathered into that map, iterating in a
    // deterministic order as we build up vectors where the order matters.
    for (auto& f : module->functions) {
      auto* func = f.get();
      auto& info = analysis.map[func];

      // For direct calls, add each call to the type of the function being
      // called.
      for (auto* call : info.calls) {
        allInfo[module->getFunction(call->target)->type].calls.push_back(call);

        // Intrinsics limit our ability to optimize in some cases. We will avoid
        // modifying any type that is used by call.without.effects, to avoid
        // the complexity of handling that. After intrinsics are lowered,
        // this optimization will be able to run at full power anyhow.
        if (Intrinsics(*module).isCallWithoutEffects(call)) {
          // The last operand is the actual call target.
          auto* target = call->operands.back();
          if (target->type != Type::unreachable) {
            allInfo[target->type.getHeapType()].optimizable = false;
          }
        }
      }

      // For indirect calls, add each call_ref to the type the call_ref uses.
      for (auto* callRef : info.callRefs) {
        auto calledType = callRef->target->type;
        if (calledType != Type::unreachable) {
          allInfo[calledType.getHeapType()].callRefs.push_back(callRef);
        }
      }

      // A parameter used in this function is used in the heap type - just one
      // function is enough to prevent the parameter from being removed.
      auto& allUsedParams = allInfo[func->type].usedParams;
      for (auto index : info.usedParams) {
        allUsedParams.insert(index);
      }

      if (!info.optimizable) {
        allInfo[func->type].optimizable = false;
      }

      sigFuncs[func->type].push_back(func);
    }

    // Find the public types, which cannot be modified.
    for (auto type : ModuleUtils::getPublicHeapTypes(*module)) {
      if (type.isFunction()) {
        allInfo[type].optimizable = false;
      }
    }

    // Similarly, we cannot yet modify types used in exception handling or stack
    // switching tags. TODO.
    for (auto& tag : module->tags) {
      allInfo[tag->type].optimizable = false;
    }

    // A type must have the same number of parameters and results as its
    // supertypes and subtypes, so we only attempt to modify types without
    // supertypes or subtypes.
    // TODO We could handle "cycles" where we remove fields from a group of
    //      types with subtyping relations at once.
    SubTypes subTypes(*module);

    // Maps each heap type to the possible pruned signature. We will fill this
    // during analysis and then use it while doing an update of the types. If a
    // type has no improvement that we can find, it will not appear in this map.
    std::unordered_map<HeapType, Signature> newSignatures;

    // Find parameters to prune.
    //
    // TODO: The order matters here, and more than one cycle can find more work
    //       in some cases, as finding a parameter is a constant and removing it
    //       can lead to another call (that receives that parameter's value) to
    //       now have constant parameters as well, and so it becomes
    //       optimizable. We could do a topological sort or greatest fixed point
    //       analysis to be optimal (that could handle a recursive call with a
    //       constant).
    for (auto& [type, funcs] : sigFuncs) {
      auto sig = type.getSignature();
      auto& info = allInfo[type];
      auto& usedParams = info.usedParams;
      auto numParams = sig.params.size();

      if (!info.optimizable) {
        continue;
      }

      if (!subTypes.getImmediateSubTypes(type).empty()) {
        continue;
      }
      if (auto super = type.getDeclaredSuperType()) {
        if (super->isSignature()) {
          continue;
        }
      }

      // Apply constant indexes: find the parameters that are always sent a
      // constant value, and apply that value in the function. That then makes
      // the parameter unused (since the applied value makes us ignore the value
      // arriving in the parameter).
      auto optimizedIndexes = ParamUtils::applyConstantValues(
        funcs, info.calls, info.callRefs, module);
      for (auto i : optimizedIndexes) {
        usedParams.erase(i);
      }

      if (usedParams.size() == numParams) {
        // All parameters are used, give up on this one.
        continue;
      }

      // We found possible work! Find the specific params that are unused & try
      // to prune them.
      SortedVector unusedParams;
      for (Index i = 0; i < numParams; i++) {
        if (usedParams.count(i) == 0) {
          unusedParams.insert(i);
        }
      }

      auto oldParams = sig.params;
      auto [removedIndexes, outcome] =
        ParamUtils::removeParameters(funcs,
                                     unusedParams,
                                     info.calls,
                                     info.callRefs,
                                     module,
                                     getPassRunner());
      if (outcome == ParamUtils::RemovalOutcome::Failure) {
        // Use either a Call or a CallRef that has this type (see explanation
        // above on |callTargetsToLocalize|.
        if (!info.calls.empty()) {
          callTargetsToLocalize.insert(info.calls[0]);
        } else {
          assert(!info.callRefs.empty());
          callTargetsToLocalize.insert(info.callRefs[0]);
        }
      }
      if (removedIndexes.empty()) {
        continue;
      }

      // Success! Update the types.
      std::vector<Type> newParams;
      for (Index i = 0; i < numParams; i++) {
        if (!removedIndexes.has(i)) {
          newParams.push_back(oldParams[i]);
        }
      }

      // Create a new signature. When the TypeRewriter operates below it will
      // modify the existing heap type in place to change its signature to this
      // one (which preserves identity, that is, even if after pruning the new
      // signature is structurally identical to another one, it will remain
      // nominally different from those).
      newSignatures[type] = Signature(Type(newParams), sig.results);

      // removeParameters() updates the type as it goes, but in this pass we
      // need the type to match the other locations, nominally. That is, we need
      // all the functions of a particular type to still have the same type
      // after this operation, and that must be the exact same type at the
      // relevant call_refs and so forth. The TypeRewriter below will do the
      // right thing as it rewrites everything all at once, so we do not want
      // the type to be modified by removeParameters(), and so we undo the type
      // it made.
      //
      // Note that we cannot just ask removeParameters() to not update the type,
      // as it adds a new local there, whose index depends on the type (which
      // contains the # of parameters, and that determine where non-parameter
      // local indexes begin). Rather than have it update the type and then undo
      // that, which would add more complexity in that method, undo the change
      // here.
      for (auto* func : funcs) {
        func->type = type;
      }
    }

    // Rewrite the types.
    GlobalTypeRewriter::updateSignatures(newSignatures, *module);

    if (callTargetsToLocalize.empty()) {
      return false;
    }

    // Localize after updating signatures, to not interfere with that
    // operation (localization adds locals, and the indexes of locals must be
    // taken into account in |GlobalTypeRewriter::updateSignatures| (as var
    // indexes change when params are pruned).
    std::unordered_set<HeapType> callTargetTypes;
    for (auto* call : callTargetsToLocalize) {
      HeapType type;
      if (auto* c = call->dynCast<Call>()) {
        type = module->getFunction(c->target)->type;
      } else if (auto* c = call->dynCast<CallRef>()) {
        type = c->target->type.getHeapType();
      } else {
        WASM_UNREACHABLE("bad call");
      }
      callTargetTypes.insert(type);
    }

    ParamUtils::localizeCallsTo(callTargetTypes, *module, getPassRunner());

    return true;
  }